

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

_Bool malloc_init_hard(void)

{
  malloc_init_t mVar1;
  pthread_t pVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  pthread_t pVar6;
  tsd_t *ptVar7;
  long lVar8;
  long lVar9;
  base_t *base;
  percpu_arena_mode_t pVar10;
  spin_t spinner;
  long *in_FS_OFFSET;
  uint local_2c;
  
  malloc_mutex_lock((tsdn_t *)0x0,&init_lock);
  pVar2 = malloc_initializer;
  mVar1 = duckdb_je_malloc_init_state;
  if ((duckdb_je_malloc_init_state == malloc_init_initialized) ||
     (pVar6 = pthread_self(), mVar1 == malloc_init_recursible && pVar2 == pVar6)) {
LAB_00e4e943:
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
    return false;
  }
  if (pVar2 != 0 && pVar2 != pVar6) {
    uVar5 = 0;
    do {
      init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
      if (uVar5 < 5) {
        for (local_2c = 0; local_2c >> ((byte)uVar5 & 0x1f) == 0; local_2c = local_2c + 1) {
        }
        uVar5 = uVar5 + 1;
      }
      else {
        sched_yield();
      }
      malloc_mutex_lock((tsdn_t *)0x0,&init_lock);
    } while (duckdb_je_malloc_init_state != malloc_init_initialized);
    goto LAB_00e4e943;
  }
  if ((mVar1 != malloc_init_a0_initialized) && (_Var3 = malloc_init_hard_a0_locked(), _Var3)) {
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
    return true;
  }
  init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
  ptVar7 = duckdb_je_malloc_tsd_boot0();
  if (ptVar7 == (tsd_t *)0x0) {
    return true;
  }
  duckdb_je_malloc_init_state = malloc_init_recursible;
  duckdb_je_ncpus = malloc_ncpus();
  if (duckdb_je_opt_percpu_arena != percpu_arena_disabled) {
    lVar8 = sysconf(0x54);
    lVar9 = sysconf(0x53);
    if ((lVar8 != lVar9) && (duckdb_je_opt_narenas == 0)) {
      duckdb_je_opt_percpu_arena = percpu_arena_disabled;
      duckdb_je_malloc_write
                (
                "<jemalloc>: Number of CPUs detected is not deterministic. Per-CPU arena disabled.\n"
                );
      if (duckdb_je_opt_abort_conf == true) {
        malloc_abort_invalid_conf();
      }
      if (duckdb_je_opt_abort == true) goto LAB_00e4ea3c;
    }
  }
  iVar4 = pthread_atfork(duckdb_je_jemalloc_prefork,duckdb_je_jemalloc_postfork_parent,
                         duckdb_je_jemalloc_postfork_child);
  if (iVar4 == 0) {
    _Var3 = duckdb_je_background_thread_boot0();
    if (_Var3) {
      return true;
    }
    malloc_mutex_lock((tsdn_t *)ptVar7,&init_lock);
    ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
         ptVar7->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
    if ((ptVar7->state).repr == '\0') {
      duckdb_je_tsd_slow_update(ptVar7);
    }
    if (duckdb_je_opt_percpu_arena != percpu_arena_disabled) {
      duckdb_je_opt_percpu_arena = percpu_arena_disabled;
      uVar5 = duckdb_je_opt_narenas;
      if (duckdb_je_opt_narenas == 0) {
        uVar5 = malloc_narenas_default();
      }
      duckdb_je_malloc_printf
                ("<jemalloc>: perCPU arena getcpu() not available. Setting narenas to %u.\n",
                 (ulong)uVar5);
      if (duckdb_je_opt_abort == true) goto LAB_00e4ea3c;
    }
    if (duckdb_je_opt_narenas == 0) {
      duckdb_je_opt_narenas = malloc_narenas_default();
    }
    duckdb_je_narenas_auto = duckdb_je_opt_narenas;
    if (0xffe < duckdb_je_opt_narenas) {
      duckdb_je_narenas_auto = 0xffe;
      duckdb_je_malloc_printf("<jemalloc>: Reducing narenas to limit (%d)\n",0xffe);
    }
    narenas_total.repr = duckdb_je_narenas_auto;
    _Var3 = duckdb_je_arena_init_huge(a0);
    if (_Var3) {
      LOCK();
      narenas_total.repr = narenas_total.repr + 1;
      UNLOCK();
    }
    duckdb_je_manual_arena_base = narenas_total.repr;
    base = duckdb_je_b0get();
    _Var3 = duckdb_je_background_thread_boot1((tsdn_t *)ptVar7,base);
    if (!_Var3) {
      pVar10 = duckdb_je_opt_percpu_arena + percpu_arena;
      if (duckdb_je_opt_percpu_arena == percpu_arena_disabled) {
        pVar10 = duckdb_je_opt_percpu_arena;
      }
      duckdb_je_opt_percpu_arena = pVar10;
      _Var3 = duckdb_je_malloc_mutex_boot();
      if (!_Var3) {
        duckdb_je_malloc_init_state = malloc_init_initialized;
        malloc_slow_flags =
             duckdb_je_opt_utrace << 3 |
             duckdb_je_opt_zero << 2 | duckdb_je_opt_junk_free * '\x02' | duckdb_je_opt_junk_alloc |
             malloc_slow_flags | duckdb_je_opt_xmalloc << 4;
        duckdb_je_malloc_slow = malloc_slow_flags != 0;
        post_reentrancy(ptVar7);
        init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
        pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x48));
        duckdb_je_malloc_tsd_boot1();
        ptVar7 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
        if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
          ptVar7 = duckdb_je_tsd_fetch_slow(ptVar7,false);
        }
        if (duckdb_je_opt_background_thread != true) {
          return false;
        }
        duckdb_je_background_thread_ctl_init((tsdn_t *)ptVar7);
        _Var3 = duckdb_je_background_thread_create(ptVar7,0);
        if (!_Var3) {
          return false;
        }
        return true;
      }
    }
    malloc_init_hard_cleanup((tsdn_t *)ptVar7,true);
    return true;
  }
  duckdb_je_malloc_write("<jemalloc>: Error in pthread_atfork()\n");
  if (duckdb_je_opt_abort != true) {
    return true;
  }
LAB_00e4ea3c:
  abort();
}

Assistant:

static bool
malloc_init_hard(void) {
	tsd_t *tsd;

#if defined(_WIN32) && _WIN32_WINNT < 0x0600
	_init_init_lock();
#endif
	malloc_mutex_lock(TSDN_NULL, &init_lock);

#define UNLOCK_RETURN(tsdn, ret, reentrancy)		\
	malloc_init_hard_cleanup(tsdn, reentrancy);	\
	return ret;

	if (!malloc_init_hard_needed()) {
		UNLOCK_RETURN(TSDN_NULL, false, false)
	}

	if (malloc_init_state != malloc_init_a0_initialized &&
	    malloc_init_hard_a0_locked()) {
		UNLOCK_RETURN(TSDN_NULL, true, false)
	}

	malloc_mutex_unlock(TSDN_NULL, &init_lock);
	/* Recursive allocation relies on functional tsd. */
	tsd = malloc_tsd_boot0();
	if (tsd == NULL) {
		return true;
	}
	if (malloc_init_hard_recursible()) {
		return true;
	}

	malloc_mutex_lock(tsd_tsdn(tsd), &init_lock);
	/* Set reentrancy level to 1 during init. */
	pre_reentrancy(tsd, NULL);
	/* Initialize narenas before prof_boot2 (for allocation). */
	if (malloc_init_narenas()
	    || background_thread_boot1(tsd_tsdn(tsd), b0get())) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}
	if (config_prof && prof_boot2(tsd, b0get())) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}

	malloc_init_percpu();

	if (malloc_init_hard_finish()) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}
	post_reentrancy(tsd);
	malloc_mutex_unlock(tsd_tsdn(tsd), &init_lock);

	witness_assert_lockless(witness_tsd_tsdn(
	    tsd_witness_tsdp_get_unsafe(tsd)));
	malloc_tsd_boot1();
	/* Update TSD after tsd_boot1. */
	tsd = tsd_fetch();
	if (opt_background_thread) {
		assert(have_background_thread);
		/*
		 * Need to finish init & unlock first before creating background
		 * threads (pthread_create depends on malloc).  ctl_init (which
		 * sets isthreaded) needs to be called without holding any lock.
		 */
		background_thread_ctl_init(tsd_tsdn(tsd));
		if (background_thread_create(tsd, 0)) {
			return true;
		}
	}
#undef UNLOCK_RETURN
	return false;
}